

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrinters.cpp
# Opt level: O0

void anon_unknown.dwarf_20674f::logClock(SessionWriter *writer,uint64_t clock)

{
  cx_string<1UL> cVar1;
  data_ref pacVar2;
  SessionWriter *in_RDI;
  uint64_t _binlog_sid_v;
  memory_order __b;
  memory_order __b_1;
  char (*in_stack_fffffffffffffe38) [3];
  atomic<unsigned_long> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  SessionWriter *in_stack_fffffffffffffe50;
  EventSource *eventSource;
  undefined6 in_stack_fffffffffffffe70;
  allocator local_122;
  cx_string<1UL> local_121;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  undefined8 local_108;
  undefined2 local_100;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  undefined8 local_98;
  string local_90 [32];
  undefined1 local_70 [56];
  __atomic_base<unsigned_long> local_38;
  undefined1 local_30 [16];
  SessionWriter *local_20;
  memory_order local_18;
  int local_14;
  undefined1 local_10 [16];
  
  local_30._8_8_ = &logClock::_binlog_sid;
  local_30._4_4_ = 0;
  local_70._48_8_ = in_RDI;
  local_30._0_4_ = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_38 = logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
  local_70._32_8_ = logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
  if (logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    binlog::SessionWriter::session((SessionWriter *)local_70._48_8_);
    local_108 = 0;
    local_100 = 0x80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"main",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"logClock",local_11d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestPrinters.cpp"
               ,&local_11e);
    local_98 = 0x1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"{}",&local_11f);
    eventSource = (EventSource *)local_70;
    cVar1 = binlog::detail::concatenated_tags<char_const(&)[3],unsigned_long&>
                      ((char (*) [3])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (unsigned_long *)in_stack_fffffffffffffe40);
    local_121 = cVar1;
    pacVar2 = mserialize::cx_string<1UL>::data(&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)eventSource,*pacVar2,&local_122);
    in_stack_fffffffffffffe50 =
         (SessionWriter *)
         binlog::Session::addEventSource
                   ((Session *)CONCAT26(cVar1._data,in_stack_fffffffffffffe70),eventSource);
    local_70._32_8_ = in_stack_fffffffffffffe50;
    binlog::EventSource::~EventSource((EventSource *)in_stack_fffffffffffffe40);
    std::allocator<char>::~allocator((allocator<char> *)&local_122);
    std::allocator<char>::~allocator((allocator<char> *)&local_11f);
    std::allocator<char>::~allocator((allocator<char> *)&local_11e);
    std::allocator<char>::~allocator((allocator<char> *)local_11d);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_10._8_8_ = &logClock::_binlog_sid;
    local_10._0_8_ = local_70._32_8_;
    local_14 = 5;
    in_stack_fffffffffffffe40 = &logClock::_binlog_sid;
    local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_20 = (SessionWriter *)local_10._0_8_;
    in_stack_fffffffffffffe4c = local_14;
    if (local_14 == 3) {
      ((EventSource *)in_stack_fffffffffffffe40)->id = local_10._0_8_;
    }
    else if (local_14 == 5) {
      LOCK();
      ((EventSource *)in_stack_fffffffffffffe40)->id = local_10._0_8_;
      UNLOCK();
    }
    else {
      ((EventSource *)in_stack_fffffffffffffe40)->id = local_10._0_8_;
    }
  }
  binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],unsigned_long&>
            (in_stack_fffffffffffffe50,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
             ,(uint64_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (unsigned_long *)0x26dc6f);
  return;
}

Assistant:

void logClock(binlog::SessionWriter& writer, std::uint64_t clock)
{
  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, main, clock, "{}", clock);
}